

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

NodeResult __thiscall HighsSearch::branch(HighsSearch *this)

{
  HighsPseudocost *this_00;
  HighsDomainChange boundchg;
  bool bVar1;
  Status SVar2;
  HighsInt HVar3;
  int iVar4;
  reference pvVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  int *piVar9;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_01;
  reference pvVar10;
  pointer pHVar11;
  reference piVar12;
  reference pvVar13;
  HighsSolution *pHVar14;
  const_reference pvVar15;
  Highs *option;
  Highs *option_00;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_02;
  size_type sVar16;
  double *__args;
  long lVar17;
  long *in_RDI;
  double dVar18;
  double dVar19;
  bool passStabilizerToChildNode;
  HighsInt domchgPos;
  HighsLpRelaxation *tmpLp;
  HighsLpRelaxation lpCopy;
  double downval;
  double upval;
  HighsInt colUpperPos;
  HighsInt colLowerPos;
  double cost;
  bool branchUpwards;
  double score;
  double fracval;
  HighsInt i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  double bestscore;
  NodeData *currnode;
  double downScore;
  double upScore;
  double downVal_1;
  double upVal_1;
  int64_t numnodesdown;
  int64_t numnodesup;
  double rootsol_1;
  double rootsol;
  double upVal;
  double downVal;
  double upPrio;
  double downPrio;
  HighsInt col;
  value_type branching;
  NodeData *currnode_1;
  HighsInt branchcand;
  double upNodeLb;
  double downNodeLb;
  double degeneracyFac;
  HighsInt minrelreduced;
  double reductionratio;
  int64_t sbiters;
  int64_t sbmaxiters;
  NodeResult result;
  double childLb;
  HighsInt minrel;
  undefined4 in_stack_ffffffffffffa818;
  HighsInt in_stack_ffffffffffffa81c;
  undefined4 in_stack_ffffffffffffa820;
  undefined4 in_stack_ffffffffffffa824;
  Highs *in_stack_ffffffffffffa828;
  shared_ptr<const_HighsBasis> *__args_2;
  HighsDomainChange *in_stack_ffffffffffffa830;
  double *__args_1;
  HighsSearch *in_stack_ffffffffffffa838;
  HighsDomain *in_stack_ffffffffffffa840;
  double *this_03;
  HighsPseudocost *in_stack_ffffffffffffa848;
  undefined4 in_stack_ffffffffffffa850;
  undefined4 in_stack_ffffffffffffa854;
  double in_stack_ffffffffffffa858;
  allocator *paVar20;
  HighsLpRelaxation *in_stack_ffffffffffffa860;
  undefined8 in_stack_ffffffffffffa868;
  HighsPseudocost *in_stack_ffffffffffffa870;
  allocator *value;
  undefined4 in_stack_ffffffffffffa8b8;
  undefined4 in_stack_ffffffffffffa8bc;
  Reason in_stack_ffffffffffffa8c0;
  undefined4 in_stack_ffffffffffffa8c8;
  undefined4 in_stack_ffffffffffffa8cc;
  undefined8 in_stack_ffffffffffffa8d0;
  Highs *this_04;
  double local_56d8;
  double *in_stack_ffffffffffffa940;
  undefined4 in_stack_ffffffffffffa948;
  HighsInt in_stack_ffffffffffffa94c;
  double in_stack_ffffffffffffa950;
  Highs *in_stack_ffffffffffffa958;
  undefined4 in_stack_ffffffffffffa968;
  HighsInt in_stack_ffffffffffffa96c;
  HighsLpRelaxation *in_stack_ffffffffffffa970;
  byte local_5601;
  allocator local_55c1;
  string local_55c0 [39];
  allocator local_5599;
  string local_5598 [39];
  allocator local_5571;
  string local_5570 [39];
  allocator local_5549;
  string local_5548 [32];
  HighsLpRelaxation *local_5528 [105];
  HighsLpRelaxation *in_stack_ffffffffffffafb0;
  double *in_stack_ffffffffffffb0e0;
  double *in_stack_ffffffffffffb0e8;
  int64_t in_stack_ffffffffffffb0f0;
  HighsSearch *in_stack_ffffffffffffb0f8;
  int local_148;
  int local_144;
  bool local_131;
  double local_128;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  vector<int,_std::allocator<int>_> *local_108;
  double local_100;
  reference local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  int64_t local_d0;
  int64_t local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  HighsInt local_8c;
  undefined8 local_88;
  double dStack_80;
  reference local_70;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  int64_t local_38;
  long local_30;
  NodeResult local_24;
  double local_20;
  HighsInt local_14 [4];
  NodeResult local_4;
  
  pvVar5 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
  (pvVar5->branchingdecision).column = -1;
  *(undefined1 *)((long)in_RDI + 0x3c4) = 1;
  local_14[0] = HighsPseudocost::getMinReliable((HighsPseudocost *)in_RDI[0x69]);
  local_20 = getCurrentLowerBound((HighsSearch *)0x696ee4);
  local_24 = kOpen;
  while( true ) {
    pvVar5 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                       ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
    local_5601 = 0;
    if (pvVar5->opensubtrees == '\x02') {
      SVar2 = HighsLpRelaxation::getStatus((HighsLpRelaxation *)in_RDI[1]);
      bVar1 = HighsLpRelaxation::scaledOptimal(SVar2);
      local_5601 = 0;
      if (bVar1) {
        HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)in_RDI[1]);
        bVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                          ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)in_stack_ffffffffffffa830);
        local_5601 = bVar1 ^ 0xff;
      }
    }
    if ((local_5601 & 1) == 0) goto LAB_006980cd;
    local_30 = 0;
    if (0 < local_14[0]) {
      local_38 = getStrongBranchingLpIterations
                           ((HighsSearch *)
                            CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
      iVar6 = getTotalLpIterations
                        ((HighsSearch *)
                         CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
      iVar7 = getHeuristicLpIterations
                        ((HighsSearch *)
                         CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
      iVar8 = getStrongBranchingLpIterations
                        ((HighsSearch *)
                         CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
      local_30 = ((iVar6 - iVar7) - iVar8 >> 1) + 100000;
      if (local_30 < local_38) {
        HighsPseudocost::setMinReliable((HighsPseudocost *)in_RDI[0x69],0);
      }
      else {
        lVar17 = local_30 >> 1;
        if (lVar17 < local_38) {
          local_40 = (double)(local_38 - lVar17) / (double)(local_30 - lVar17);
          local_44 = (int)(-local_40 * (double)(local_14[0] + -1) + (double)local_14[0]);
          this_00 = (HighsPseudocost *)in_RDI[0x69];
          piVar9 = std::min<int>(local_14,&local_44);
          HighsPseudocost::setMinReliable(this_00,*piVar9);
        }
      }
    }
    local_50 = HighsLpRelaxation::computeLPDegneracy
                         ((HighsLpRelaxation *)
                          CONCAT44(in_stack_ffffffffffffa8cc,in_stack_ffffffffffffa8c8),
                          (HighsDomain *)in_stack_ffffffffffffa8c0);
    HighsPseudocost::setDegeneracyFactor((HighsPseudocost *)in_RDI[0x69],local_50);
    if (10.0 <= local_50) {
      HighsPseudocost::setMinReliable((HighsPseudocost *)in_RDI[0x69],0);
    }
    local_58 = getCurrentLowerBound((HighsSearch *)0x697197);
    local_60 = getCurrentLowerBound((HighsSearch *)0x6971ad);
    local_64 = selectBranchingCandidate
                         (in_stack_ffffffffffffb0f8,in_stack_ffffffffffffb0f0,
                          in_stack_ffffffffffffb0e8,in_stack_ffffffffffffb0e0);
    local_70 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                         ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                          CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
    HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffa868 >> 0x20);
    local_20 = local_70->lower_bound;
    if (local_64 != -1) break;
    local_24 = evaluateNode((HighsSearch *)
                            CONCAT44(in_stack_ffffffffffffa94c,in_stack_ffffffffffffa948));
    if (local_24 == kSubOptimal) {
LAB_006980cd:
      *(undefined1 *)((long)in_RDI + 0x3c4) = 0;
      local_f8 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                           ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *
                            )CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
      HighsPseudocost::setMinReliable((HighsPseudocost *)in_RDI[0x69],local_14[0]);
      HighsPseudocost::setDegeneracyFactor((HighsPseudocost *)in_RDI[0x69],1.0);
      HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffa858 >> 0x20);
      if ((local_f8->opensubtrees == '\x02') && (local_24 != kSubOptimal)) {
        if ((local_f8->branchingdecision).column == -1) {
          local_100 = -1.0;
          HighsPseudocost::setDegeneracyFactor((HighsPseudocost *)in_RDI[0x69],1000000.0);
          pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x6981ae);
          local_108 = &pHVar11->integral_cols;
          local_110._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_ffffffffffffa81c,in_stack_ffffffffffffa818));
          std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffa81c,in_stack_ffffffffffffa818));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_ffffffffffffa81c,in_stack_ffffffffffffa818));
            HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffa858 >> 0x20);
            if (!bVar1) break;
            piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_110);
            iVar4 = *piVar12;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                 (long)iVar4);
            dVar18 = *pvVar13;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                 (long)iVar4);
            if (0.5 <= dVar18 - *pvVar13) {
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                   (long)iVar4);
              if ((*pvVar13 != -INFINITY) || (NAN(*pvVar13))) {
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                     (long)iVar4);
                if ((*pvVar13 != INFINITY) || (NAN(*pvVar13))) {
                  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                       (long)iVar4);
                  dVar18 = *pvVar13;
                  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                       (long)iVar4);
                  floor((dVar18 + *pvVar13 + 0.5) * 0.5);
                }
              }
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                   (long)iVar4);
              if ((*pvVar13 != -INFINITY) || (NAN(*pvVar13))) {
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                     (long)iVar4);
                local_128 = *pvVar13 + 0.5;
              }
              else {
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                     (long)iVar4);
                if ((*pvVar13 != INFINITY) || (NAN(*pvVar13))) {
                  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                       (long)iVar4);
                  local_128 = *pvVar13 - 0.5;
                }
                else {
                  local_128 = 0.5;
                }
              }
              dVar18 = HighsPseudocost::getScore
                                 ((HighsPseudocost *)in_stack_ffffffffffffa840,
                                  (HighsInt)((ulong)in_stack_ffffffffffffa838 >> 0x20),
                                  (double)in_stack_ffffffffffffa830);
              if (local_100 < dVar18) {
                local_100 = dVar18;
                SVar2 = HighsLpRelaxation::getStatus((HighsLpRelaxation *)in_RDI[1]);
                bVar1 = HighsLpRelaxation::unscaledDualFeasible(SVar2);
                if (bVar1) {
                  pHVar14 = HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x6984ff);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (&pHVar14->col_dual,(long)iVar4);
                  local_56d8 = *pvVar15;
                }
                else {
                  local_56d8 = HighsMipSolver::colCost
                                         ((HighsMipSolver *)
                                          CONCAT44(in_stack_ffffffffffffa824,
                                                   in_stack_ffffffffffffa820),
                                          in_stack_ffffffffffffa81c);
                }
                pHVar11 = std::
                          unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                          operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                      *)0x698588);
                if ((ABS(local_56d8) < pHVar11->feastol || ABS(local_56d8) == pHVar11->feastol) ||
                   (dVar18 = getCutoffBound((HighsSearch *)
                                            CONCAT44(in_stack_ffffffffffffa824,
                                                     in_stack_ffffffffffffa820)), INFINITY <= dVar18
                   )) {
                  dVar18 = HighsPseudocost::getAvgInferencesUp
                                     ((HighsPseudocost *)
                                      CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                                      in_stack_ffffffffffffa81c);
                  dVar19 = HighsPseudocost::getAvgInferencesDown
                                     ((HighsPseudocost *)
                                      CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                                      in_stack_ffffffffffffa81c);
                  pHVar11 = std::
                            unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                          *)0x698639);
                  if (dVar18 <= dVar19 + pHVar11->feastol) {
                    dVar18 = HighsPseudocost::getAvgInferencesUp
                                       ((HighsPseudocost *)
                                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820
                                                ),in_stack_ffffffffffffa81c);
                    dVar19 = HighsPseudocost::getAvgInferencesDown
                                       ((HighsPseudocost *)
                                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820
                                                ),in_stack_ffffffffffffa81c);
                    pHVar11 = std::
                              unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                            *)0x6986c5);
                    local_131 = dVar19 - pHVar11->feastol <= dVar18;
                    if (local_131) {
                      HighsDomain::getNumDomainChanges((HighsDomain *)0x698720);
                      HighsDomain::getColLowerPos
                                (in_stack_ffffffffffffa840,
                                 (HighsInt)((ulong)in_stack_ffffffffffffa838 >> 0x20),
                                 (HighsInt)in_stack_ffffffffffffa838,
                                 (HighsInt *)in_stack_ffffffffffffa830);
                      HighsDomain::getNumDomainChanges((HighsDomain *)0x69876c);
                      HighsDomain::getColUpperPos
                                (in_stack_ffffffffffffa840,
                                 (HighsInt)((ulong)in_stack_ffffffffffffa838 >> 0x20),
                                 (HighsInt)in_stack_ffffffffffffa838,
                                 (HighsInt *)in_stack_ffffffffffffa830);
                    }
                    local_131 = local_131 && local_144 <= local_148;
                  }
                  else {
                    local_131 = true;
                  }
                }
                else {
                  local_131 = 0.0 < local_56d8;
                }
                if (local_131) {
                  dVar18 = ceil(local_128);
                  local_f8->branching_point = dVar18;
                  (local_f8->branchingdecision).boundtype = kLower;
                  (local_f8->branchingdecision).column = iVar4;
                  (local_f8->branchingdecision).boundval = dVar18;
                }
                else {
                  dVar18 = floor(local_128);
                  local_f8->branching_point = dVar18;
                  (local_f8->branchingdecision).boundtype = kUpper;
                  (local_f8->branchingdecision).column = iVar4;
                  (local_f8->branchingdecision).boundval = dVar18;
                }
              }
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_110);
          }
          HighsPseudocost::setDegeneracyFactor((HighsPseudocost *)in_RDI[0x69],1.0);
        }
        if ((local_f8->branchingdecision).column == -1) {
          SVar2 = HighsLpRelaxation::getStatus((HighsLpRelaxation *)in_RDI[1]);
          if (SVar2 == kOptimal) {
            local_f8->opensubtrees = '\0';
            local_4 = kLpInfeasible;
          }
          else {
            HighsLpRelaxation::setIterationLimit(in_stack_ffffffffffffa860,HVar3);
            this_04 = (Highs *)(local_5528 + 3);
            HighsLpRelaxation::HighsLpRelaxation
                      (in_stack_ffffffffffffa970,
                       (HighsMipSolver *)
                       CONCAT44(in_stack_ffffffffffffa96c,in_stack_ffffffffffffa968));
            HighsLpRelaxation::loadModel(in_stack_ffffffffffffafb0);
            option = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(local_5528 + 3));
            HVar3 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
            iVar4 = HVar3 + -1;
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x698999);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x6989b5);
            Highs::changeColsBounds
                      (in_stack_ffffffffffffa958,
                       (HighsInt)((ulong)in_stack_ffffffffffffa950 >> 0x20),
                       SUB84(in_stack_ffffffffffffa950,0),
                       (double *)CONCAT44(in_stack_ffffffffffffa94c,in_stack_ffffffffffffa948),
                       in_stack_ffffffffffffa940);
            local_5528[0] = (HighsLpRelaxation *)(local_5528 + 3);
            std::swap<HighsLpRelaxation*>(local_5528,(HighsLpRelaxation **)(in_RDI + 1));
            option_00 = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
            value = &local_5549;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_5548,"presolve",value);
            Highs::setOptionValue
                      (this_04,(string *)option,(string *)CONCAT44(HVar3,in_stack_ffffffffffffa8c8))
            ;
            std::__cxx11::string::~string(local_5548);
            std::allocator<char>::~allocator((allocator<char> *)&local_5549);
            local_24 = evaluateNode((HighsSearch *)
                                    CONCAT44(in_stack_ffffffffffffa94c,in_stack_ffffffffffffa948));
            if (local_24 == kOpen) {
              HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
              Highs::clearSolver((Highs *)CONCAT44(in_stack_ffffffffffffa824,
                                                   in_stack_ffffffffffffa820));
              HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5570,"simplex_strategy",&local_5571);
              Highs::setOptionValue
                        (in_stack_ffffffffffffa828,
                         (string *)CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                         in_stack_ffffffffffffa81c);
              std::__cxx11::string::~string(local_5570);
              std::allocator<char>::~allocator((allocator<char> *)&local_5571);
              local_24 = evaluateNode((HighsSearch *)
                                      CONCAT44(in_stack_ffffffffffffa94c,in_stack_ffffffffffffa948))
              ;
              HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
              paVar20 = &local_5599;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5598,"simplex_strategy",paVar20);
              Highs::setOptionValue
                        (in_stack_ffffffffffffa828,
                         (string *)CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                         in_stack_ffffffffffffa81c);
              std::__cxx11::string::~string(local_5598);
              std::allocator<char>::~allocator((allocator<char> *)&local_5599);
              if (local_24 == kOpen) {
                HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
                Highs::clearSolver((Highs *)CONCAT44(in_stack_ffffffffffffa824,
                                                     in_stack_ffffffffffffa820));
                HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)in_RDI[1]);
                paVar20 = &local_55c1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_55c0,"solver",paVar20);
                Highs::setOptionValue
                          ((Highs *)CONCAT44(iVar4,in_stack_ffffffffffffa8b8),(string *)option_00,
                           (char *)value);
                std::__cxx11::string::~string(local_55c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_55c1);
                local_24 = evaluateNode((HighsSearch *)
                                        CONCAT44(in_stack_ffffffffffffa94c,in_stack_ffffffffffffa948
                                                ));
                if (local_24 == kOpen) {
                  highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kWarning,
                               "Failed to solve node with all integer columns fixed. Declaring node infeasible.\n"
                              );
                  local_f8->opensubtrees = '\0';
                  local_24 = kLpInfeasible;
                }
              }
            }
            std::swap<HighsLpRelaxation*>(local_5528,(HighsLpRelaxation **)(in_RDI + 1));
            local_4 = local_24;
            HighsLpRelaxation::~HighsLpRelaxation
                      ((HighsLpRelaxation *)
                       CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
          }
        }
        else {
          this_02 = HighsDomain::getDomainChangeStack((HighsDomain *)(in_RDI + 2));
          sVar16 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(this_02)
          ;
          HVar3 = (HighsInt)sVar16;
          bVar1 = orbitsValidInChildNode(in_stack_ffffffffffffa838,in_stack_ffffffffffffa830);
          __args_2 = (shared_ptr<const_HighsBasis> *)(in_RDI + 2);
          HighsDomain::Reason::branching();
          boundchg.boundval._4_4_ = in_stack_ffffffffffffa8cc;
          boundchg.boundval._0_4_ = in_stack_ffffffffffffa8c8;
          boundchg.column = (int)in_stack_ffffffffffffa8d0;
          boundchg.boundtype = (int)((ulong)in_stack_ffffffffffffa8d0 >> 0x20);
          HighsDomain::changeBound
                    ((HighsDomain *)CONCAT44(in_stack_ffffffffffffa8bc,in_stack_ffffffffffffa8b8),
                     boundchg,in_stack_ffffffffffffa8c0);
          local_f8->opensubtrees = '\x01';
          __args_1 = (double *)(in_RDI + 0x7d);
          __args = std::max<double>(&local_20,&local_f8->lower_bound);
          this_03 = &local_f8->estimate;
          if (bVar1) {
            std::shared_ptr<const_StabilizerOrbits>::shared_ptr
                      ((shared_ptr<const_StabilizerOrbits> *)
                       CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                       (shared_ptr<const_StabilizerOrbits> *)
                       CONCAT44(in_stack_ffffffffffffa81c,in_stack_ffffffffffffa818));
          }
          else {
            std::shared_ptr<const_StabilizerOrbits>::shared_ptr
                      ((shared_ptr<const_StabilizerOrbits> *)
                       CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                       (nullptr_t)CONCAT44(in_stack_ffffffffffffa81c,in_stack_ffffffffffffa818));
          }
          std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
          emplace_back<double_const&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
                    ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                     this_03,__args,__args_1,__args_2,
                     (shared_ptr<const_StabilizerOrbits> *)
                     CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
          std::shared_ptr<const_StabilizerOrbits>::~shared_ptr
                    ((shared_ptr<const_StabilizerOrbits> *)0x699000);
          pvVar5 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                             ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                               *)CONCAT44(HVar3,in_stack_ffffffffffffa820));
          pvVar5->domgchgStackPos = HVar3;
          local_4 = kBranched;
        }
      }
      else {
        local_4 = local_24;
      }
      return local_4;
    }
  }
  this_01 = HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)in_RDI[1]);
  pvVar10 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator[](this_01,(long)local_64);
  local_88 = *(undefined8 *)pvVar10;
  dStack_80 = pvVar10->second;
  (local_70->branchingdecision).column = (HighsInt)local_88;
  local_70->branching_point = dStack_80;
  local_8c = (HighsInt)local_88;
  switch((int)in_RDI[0x79]) {
  case 0:
    (local_70->branchingdecision).boundtype = kLower;
    dVar18 = ceil(local_70->branching_point);
    (local_70->branchingdecision).boundval = dVar18;
    local_70->other_child_lb = local_58;
    local_20 = local_60;
    break;
  case 1:
    (local_70->branchingdecision).boundtype = kUpper;
    dVar18 = floor(local_70->branching_point);
    (local_70->branchingdecision).boundval = dVar18;
    local_70->other_child_lb = local_60;
    local_20 = local_58;
    break;
  case 2:
    dVar18 = HighsPseudocost::getAvgInferencesDown
                       ((HighsPseudocost *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                        in_stack_ffffffffffffa81c);
    pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x6973af);
    local_98 = dVar18 + pHVar11->epsilon;
    dVar18 = HighsPseudocost::getAvgInferencesUp
                       ((HighsPseudocost *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                        in_stack_ffffffffffffa81c);
    pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x697407);
    local_a0 = dVar18 + pHVar11->epsilon;
    local_a8 = floor(local_70->branching_point);
    local_b0 = ceil(local_70->branching_point);
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa830);
    if (bVar1) {
      if ((local_70->lp_objective != -INFINITY) || (NAN(local_70->lp_objective))) {
        HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x69758d);
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa8c0,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffa8bc,in_stack_ffffffffffffa8b8));
      }
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x6975bf);
      bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa830);
      if (!bVar1) {
        pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                  operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              *)0x6975ed);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&pHVar11->rootlpsol,(long)local_8c);
        local_c0 = *pvVar13;
        if (local_a8 <= local_c0) {
          if (local_b0 < local_c0) {
            local_c0 = local_b0;
          }
        }
        else {
          local_c0 = local_a8;
        }
        local_a0 = ((local_70->branching_point - local_c0) + 1.0) * local_a0;
        local_98 = ((local_c0 - local_70->branching_point) + 1.0) * local_98;
      }
    }
    else {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7a),(long)local_8c
                          );
      local_b8 = *pvVar13;
      if (local_a8 <= local_b8) {
        if (local_b0 < local_b8) {
          local_b8 = local_b0;
        }
      }
      else {
        local_b8 = local_a8;
      }
      local_a0 = ((local_70->branching_point - local_b8) + 1.0) * local_a0;
      local_98 = ((local_b8 - local_70->branching_point) + 1.0) * local_98;
    }
    dVar18 = local_a0;
    pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x6976f8);
    if (dVar18 + pHVar11->epsilon < local_98) {
      (local_70->branchingdecision).boundtype = kUpper;
      (local_70->branchingdecision).boundval = local_a8;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    else {
      (local_70->branchingdecision).boundtype = kLower;
      (local_70->branchingdecision).boundval = local_b0;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    break;
  case 3:
    dVar18 = HighsMipSolver::colCost
                       ((HighsMipSolver *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                        in_stack_ffffffffffffa81c);
    if (dVar18 < 0.0) {
      (local_70->branchingdecision).boundtype = kUpper;
      dVar18 = floor(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    else {
      (local_70->branchingdecision).boundtype = kLower;
      dVar18 = ceil(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    break;
  case 4:
    bVar1 = HighsRandom::bit((HighsRandom *)
                             CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820));
    if (bVar1) {
      (local_70->branchingdecision).boundtype = kLower;
      dVar18 = ceil(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    else {
      (local_70->branchingdecision).boundtype = kUpper;
      dVar18 = floor(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    break;
  case 5:
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x69799f)
    ;
    dVar18 = HighsPseudocost::getPseudocostUp
                       ((HighsPseudocost *)in_stack_ffffffffffffa860,
                        (HighsInt)((ulong)in_stack_ffffffffffffa858 >> 0x20),
                        (double)CONCAT44(in_stack_ffffffffffffa854,in_stack_ffffffffffffa850),
                        (double)in_stack_ffffffffffffa848);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x697a17)
    ;
    dVar19 = HighsPseudocost::getPseudocostDown
                       (in_stack_ffffffffffffa870,HVar3,(double)in_stack_ffffffffffffa860,
                        in_stack_ffffffffffffa858);
    if (dVar18 <= dVar19) {
      (local_70->branchingdecision).boundtype = kLower;
      dVar18 = ceil(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    else {
      (local_70->branchingdecision).boundtype = kUpper;
      dVar18 = floor(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    break;
  case 6:
    dVar18 = HighsPseudocost::getPseudocostUp
                       ((HighsPseudocost *)in_stack_ffffffffffffa838,
                        (HighsInt)((ulong)in_stack_ffffffffffffa830 >> 0x20),
                        (double)in_stack_ffffffffffffa828);
    dVar19 = HighsPseudocost::getPseudocostDown
                       (in_stack_ffffffffffffa848,
                        (HighsInt)((ulong)in_stack_ffffffffffffa840 >> 0x20),
                        (double)in_stack_ffffffffffffa838);
    if (dVar18 < dVar19) {
      (local_70->branchingdecision).boundtype = kUpper;
      dVar18 = floor(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    else {
      (local_70->branchingdecision).boundtype = kLower;
      dVar18 = ceil(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    break;
  case 7:
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x697c36)
    ;
    local_c8 = HighsNodeQueue::numNodesUp
                         ((HighsNodeQueue *)
                          CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                          in_stack_ffffffffffffa81c);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x697c6e)
    ;
    local_d0 = HighsNodeQueue::numNodesDown
                         ((HighsNodeQueue *)
                          CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                          in_stack_ffffffffffffa81c);
    if (local_d0 < local_c8) {
      (local_70->branchingdecision).boundtype = kLower;
      dVar18 = ceil(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
    else if (local_c8 < local_d0) {
      (local_70->branchingdecision).boundtype = kUpper;
      dVar18 = floor(local_70->branching_point);
      (local_70->branchingdecision).boundval = dVar18;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    else {
      dVar18 = HighsMipSolver::colCost
                         ((HighsMipSolver *)
                          CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                          in_stack_ffffffffffffa81c);
      if (dVar18 < 0.0) {
        (local_70->branchingdecision).boundtype = kUpper;
        dVar18 = floor(local_70->branching_point);
        (local_70->branchingdecision).boundval = dVar18;
        local_70->other_child_lb = local_60;
        local_20 = local_58;
      }
      else {
        (local_70->branchingdecision).boundtype = kLower;
        dVar18 = ceil(local_70->branching_point);
        (local_70->branchingdecision).boundval = dVar18;
        local_70->other_child_lb = local_58;
        local_20 = local_60;
      }
    }
    break;
  case 8:
    local_d8 = ceil(local_70->branching_point);
    local_e0 = floor(local_70->branching_point);
    dVar18 = HighsPseudocost::getAvgInferencesUp
                       ((HighsPseudocost *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                        in_stack_ffffffffffffa81c);
    in_stack_ffffffffffffa958 = (Highs *)(dVar18 + 1.0);
    in_stack_ffffffffffffa940 = (double *)in_RDI[0x69];
    in_stack_ffffffffffffa950 = local_70->branching_point;
    in_stack_ffffffffffffa94c = local_8c;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x697ef0)
    ;
    local_e8 = HighsPseudocost::getPseudocostUp
                         ((HighsPseudocost *)in_stack_ffffffffffffa860,
                          (HighsInt)((ulong)in_stack_ffffffffffffa858 >> 0x20),
                          (double)CONCAT44(in_stack_ffffffffffffa854,in_stack_ffffffffffffa850),
                          (double)in_stack_ffffffffffffa848);
    local_e8 = (double)in_stack_ffffffffffffa958 / local_e8;
    dVar18 = HighsPseudocost::getAvgInferencesDown
                       ((HighsPseudocost *)
                        CONCAT44(in_stack_ffffffffffffa824,in_stack_ffffffffffffa820),
                        in_stack_ffffffffffffa81c);
    in_stack_ffffffffffffa970 = (HighsLpRelaxation *)local_70->branching_point;
    in_stack_ffffffffffffa96c = local_8c;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x697fab)
    ;
    local_f0 = HighsPseudocost::getPseudocostDown
                         (in_stack_ffffffffffffa870,HVar3,(double)in_stack_ffffffffffffa860,
                          in_stack_ffffffffffffa858);
    local_f0 = (dVar18 + 1.0) / local_f0;
    if (local_e8 < local_f0) {
      (local_70->branchingdecision).boundtype = kUpper;
      (local_70->branchingdecision).boundval = local_e0;
      local_70->other_child_lb = local_60;
      local_20 = local_58;
    }
    else {
      (local_70->branchingdecision).boundtype = kLower;
      (local_70->branchingdecision).boundval = local_d8;
      local_70->other_child_lb = local_58;
      local_20 = local_60;
    }
  }
  local_24 = kBranched;
  goto LAB_006980cd;
}

Assistant:

HighsSearch::NodeResult HighsSearch::branch() {
  assert(localdom.getChangedCols().empty());

  assert(nodestack.back().opensubtrees == 2);
  nodestack.back().branchingdecision.column = -1;
  inbranching = true;

  HighsInt minrel = pseudocost.getMinReliable();
  double childLb = getCurrentLowerBound();
  NodeResult result = NodeResult::kOpen;
  while (nodestack.back().opensubtrees == 2 &&
         lp->scaledOptimal(lp->getStatus()) &&
         !lp->getFractionalIntegers().empty()) {
    int64_t sbmaxiters = 0;
    if (minrel > 0) {
      int64_t sbiters = getStrongBranchingLpIterations();
      sbmaxiters =
          100000 + ((getTotalLpIterations() - getHeuristicLpIterations() -
                     getStrongBranchingLpIterations()) >>
                    1);
      if (sbiters > sbmaxiters) {
        pseudocost.setMinReliable(0);
      } else if (sbiters > (sbmaxiters >> 1)) {
        double reductionratio = (sbiters - (sbmaxiters >> 1)) /
                                (double)(sbmaxiters - (sbmaxiters >> 1));

        HighsInt minrelreduced = int(minrel - reductionratio * (minrel - 1));
        pseudocost.setMinReliable(std::min(minrel, minrelreduced));
      }
    }

    double degeneracyFac = lp->computeLPDegneracy(localdom);
    pseudocost.setDegeneracyFactor(degeneracyFac);
    if (degeneracyFac >= 10.0) pseudocost.setMinReliable(0);
    // if (!mipsolver.submip)
    //  printf("selecting branching cand with minrel=%d\n",
    //         pseudocost.getMinReliable());
    double downNodeLb = getCurrentLowerBound();
    double upNodeLb = getCurrentLowerBound();
    HighsInt branchcand =
        selectBranchingCandidate(sbmaxiters, downNodeLb, upNodeLb);
    // if (!mipsolver.submip)
    //   printf("branching cand returned as %d\n", branchcand);
    NodeData& currnode = nodestack.back();
    childLb = currnode.lower_bound;
    if (branchcand != -1) {
      auto branching = lp->getFractionalIntegers()[branchcand];
      currnode.branchingdecision.column = branching.first;
      currnode.branching_point = branching.second;

      HighsInt col = branching.first;

      switch (childselrule) {
        case ChildSelectionRule::kUp:
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.boundval =
              std::ceil(currnode.branching_point);
          currnode.other_child_lb = downNodeLb;
          childLb = upNodeLb;
          break;
        case ChildSelectionRule::kDown:
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.boundval =
              std::floor(currnode.branching_point);
          currnode.other_child_lb = upNodeLb;
          childLb = downNodeLb;
          break;
        case ChildSelectionRule::kRootSol: {
          double downPrio = pseudocost.getAvgInferencesDown(col) +
                            mipsolver.mipdata_->epsilon;
          double upPrio =
              pseudocost.getAvgInferencesUp(col) + mipsolver.mipdata_->epsilon;
          double downVal = std::floor(currnode.branching_point);
          double upVal = std::ceil(currnode.branching_point);
          if (!subrootsol.empty()) {
            double rootsol = subrootsol[col];
            if (rootsol < downVal)
              rootsol = downVal;
            else if (rootsol > upVal)
              rootsol = upVal;

            upPrio *= (1.0 + (currnode.branching_point - rootsol));
            downPrio *= (1.0 + (rootsol - currnode.branching_point));

          } else {
            if (currnode.lp_objective != -kHighsInf)
              subrootsol = lp->getSolution().col_value;
            if (!mipsolver.mipdata_->rootlpsol.empty()) {
              double rootsol = mipsolver.mipdata_->rootlpsol[col];
              if (rootsol < downVal)
                rootsol = downVal;
              else if (rootsol > upVal)
                rootsol = upVal;

              upPrio *= (1.0 + (currnode.branching_point - rootsol));
              downPrio *= (1.0 + (rootsol - currnode.branching_point));
            }
          }
          if (upPrio + mipsolver.mipdata_->epsilon >= downPrio) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kObj:
          if (mipsolver.colCost(col) >= 0) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kRandom:
          if (random.bit()) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kBestCost: {
          if (pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol) >
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kWorstCost:
          if (pseudocost.getPseudocostUp(col, currnode.branching_point) >=
              pseudocost.getPseudocostDown(col, currnode.branching_point)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kDisjunction: {
          int64_t numnodesup;
          int64_t numnodesdown;
          numnodesup = mipsolver.mipdata_->nodequeue.numNodesUp(col);
          numnodesdown = mipsolver.mipdata_->nodequeue.numNodesDown(col);
          if (numnodesup > numnodesdown) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else if (numnodesdown > numnodesup) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            if (mipsolver.colCost(col) >= 0) {
              currnode.branchingdecision.boundtype = HighsBoundType::kLower;
              currnode.branchingdecision.boundval =
                  std::ceil(currnode.branching_point);
              currnode.other_child_lb = downNodeLb;
              childLb = upNodeLb;
            } else {
              currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
              currnode.branchingdecision.boundval =
                  std::floor(currnode.branching_point);
              currnode.other_child_lb = upNodeLb;
              childLb = downNodeLb;
            }
          }
          break;
        }
        case ChildSelectionRule::kHybridInferenceCost: {
          double upVal = std::ceil(currnode.branching_point);
          double downVal = std::floor(currnode.branching_point);
          double upScore =
              (1 + pseudocost.getAvgInferencesUp(col)) /
              pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol);
          double downScore =
              (1 + pseudocost.getAvgInferencesDown(col)) /
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol);

          if (upScore >= downScore) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
        }
      }
      result = NodeResult::kBranched;
      break;
    }

    assert(!localdom.getChangedCols().empty());
    result = evaluateNode();
    if (result == NodeResult::kSubOptimal) break;
  }
  inbranching = false;
  NodeData& currnode = nodestack.back();
  pseudocost.setMinReliable(minrel);
  pseudocost.setDegeneracyFactor(1.0);

  assert(currnode.opensubtrees == 2 || currnode.opensubtrees == 0);

  if (currnode.opensubtrees != 2 || result == NodeResult::kSubOptimal)
    return result;

  if (currnode.branchingdecision.column == -1) {
    double bestscore = -1.0;
    // solution branching failed, so choose any integer variable to branch
    // on in case we have a different solution status could happen due to a
    // fail in the LP solution process
    pseudocost.setDegeneracyFactor(1e6);

    for (HighsInt i : mipsolver.mipdata_->integral_cols) {
      if (localdom.col_upper_[i] - localdom.col_lower_[i] < 0.5) continue;

      double fracval;
      if (localdom.col_lower_[i] != -kHighsInf &&
          localdom.col_upper_[i] != kHighsInf)
        fracval = std::floor(0.5 * (localdom.col_lower_[i] +
                                    localdom.col_upper_[i] + 0.5)) +
                  0.5;
      if (localdom.col_lower_[i] != -kHighsInf)
        fracval = localdom.col_lower_[i] + 0.5;
      else if (localdom.col_upper_[i] != kHighsInf)
        fracval = localdom.col_upper_[i] - 0.5;
      else
        fracval = 0.5;

      double score = pseudocost.getScore(i, fracval);
      assert(score >= 0.0);

      if (score > bestscore) {
        bestscore = score;
        bool branchUpwards;
        double cost = lp->unscaledDualFeasible(lp->getStatus())
                          ? lp->getSolution().col_dual[i]
                          : mipsolver.colCost(i);
        if (std::fabs(cost) > mipsolver.mipdata_->feastol &&
            getCutoffBound() < kHighsInf) {
          // branch in direction of worsening cost first in case the column has
          // cost and we do have an upper bound
          branchUpwards = cost > 0;
        } else if (pseudocost.getAvgInferencesUp(i) >
                   pseudocost.getAvgInferencesDown(i) +
                       mipsolver.mipdata_->feastol) {
          // column does not have (reduced) cost above tolerance so branch in
          // direction of more inferences
          branchUpwards = true;
        } else if (pseudocost.getAvgInferencesUp(i) <
                   pseudocost.getAvgInferencesDown(i) -
                       mipsolver.mipdata_->feastol) {
          branchUpwards = false;
        } else {
          // number of inferences give a tie, so we branch in the direction that
          // does have a less recent domain change to avoid branching the same
          // integer column into the same direction over and over
          HighsInt colLowerPos;
          HighsInt colUpperPos;
          localdom.getColLowerPos(i, localdom.getNumDomainChanges(),
                                  colLowerPos);
          localdom.getColUpperPos(i, localdom.getNumDomainChanges(),
                                  colUpperPos);
          branchUpwards = colLowerPos <= colUpperPos;
        }
        if (branchUpwards) {
          double upval = std::ceil(fracval);
          currnode.branching_point = upval;
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = upval;
        } else {
          double downval = std::floor(fracval);
          currnode.branching_point = downval;
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = downval;
        }
      }
    }

    pseudocost.setDegeneracyFactor(1);
  }

  if (currnode.branchingdecision.column == -1) {
    if (lp->getStatus() == HighsLpRelaxation::Status::kOptimal) {
      // if the LP was solved to optimality and all columns are fixed, then this
      // particular assignment is not feasible or has a worse objective in the
      // original space, otherwise the node would not be open. Hence we prune
      // this particular assignment
      currnode.opensubtrees = 0;
      result = NodeResult::kLpInfeasible;
      return result;
    }
    lp->setIterationLimit();

    // create a fresh LP only with model rows since all integer columns are
    // fixed, the cutting planes are not required and the LP could not be solved
    // so we want to make it as easy as possible
    HighsLpRelaxation lpCopy(mipsolver);
    lpCopy.loadModel();
    lpCopy.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                          localdom.col_lower_.data(),
                                          localdom.col_upper_.data());
    // temporarily use the fresh LP for the HighsSearch class
    HighsLpRelaxation* tmpLp = &lpCopy;
    std::swap(tmpLp, lp);

    // reevaluate the node with LP presolve enabled
    lp->getLpSolver().setOptionValue("presolve", kHighsOnString);
    result = evaluateNode();

    if (result == NodeResult::kOpen) {
      // LP still not solved, reevaluate with primal simplex
      lp->getLpSolver().clearSolver();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
      result = evaluateNode();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyDual);
      if (result == NodeResult::kOpen) {
        // LP still not solved, reevaluate with IPM instead of simplex
        lp->getLpSolver().clearSolver();
        lp->getLpSolver().setOptionValue("solver", "ipm");
        result = evaluateNode();

        if (result == NodeResult::kOpen) {
          highsLogUser(mipsolver.options_mip_->log_options,
                       HighsLogType::kWarning,
                       "Failed to solve node with all integer columns "
                       "fixed. Declaring node infeasible.\n");
          // LP still not solved, give up and declare as infeasible
          currnode.opensubtrees = 0;
          result = NodeResult::kLpInfeasible;
        }
      }
    }

    // restore old lp relaxation
    std::swap(tmpLp, lp);

    return result;
  }

  // finally open a new node with the branching decision added
  // and remember that we have one open subtree left
  HighsInt domchgPos = localdom.getDomainChangeStack().size();

  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  currnode.opensubtrees = 1;
  nodestack.emplace_back(
      std::max(childLb, currnode.lower_bound), currnode.estimate,
      currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;

  return NodeResult::kBranched;
}